

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
          (CodedInputStream *this,Limit limit)

{
  bool bVar1;
  int iVar2;
  uint8_t *puVar3;
  LogMessage *other;
  int iVar4;
  LogFinisher local_61;
  LogMessage local_60;
  
  bVar1 = this->legitimate_message_end_;
  this->current_limit_ = limit;
  iVar2 = this->buffer_size_after_limit_;
  puVar3 = this->buffer_end_;
  this->buffer_end_ = puVar3 + iVar2;
  if (this->total_bytes_limit_ < limit) {
    limit = this->total_bytes_limit_;
  }
  iVar4 = this->total_bytes_read_ - limit;
  if (iVar4 == 0 || this->total_bytes_read_ < limit) {
    this->buffer_size_after_limit_ = 0;
  }
  else {
    this->buffer_size_after_limit_ = iVar4;
    this->buffer_end_ = puVar3 + iVar2 + -(long)iVar4;
  }
  this->legitimate_message_end_ = false;
  if (this->recursion_limit_ <= this->recursion_budget_) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0xa1);
    other = internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: (recursion_budget_) < (recursion_limit_): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  this->recursion_budget_ = this->recursion_budget_ + 1;
  return bVar1;
}

Assistant:

bool CodedInputStream::DecrementRecursionDepthAndPopLimit(Limit limit) {
  bool result = ConsumedEntireMessage();
  PopLimit(limit);
  GOOGLE_DCHECK_LT(recursion_budget_, recursion_limit_);
  ++recursion_budget_;
  return result;
}